

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternAddressMapper.cpp
# Opt level: O1

void __thiscall
PatternAddressMapper::determine_victims
          (PatternAddressMapper *this,
          vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>
          *agg_access_patterns)

{
  size_t bk;
  size_t sVar1;
  uint uVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  __hashtable *__h;
  int delta_nrows;
  int iVar6;
  pointer __k;
  _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  undefined1 local_a0 [8];
  DRAMAddr victim_start;
  void *local_80;
  pointer local_78;
  pointer local_70;
  _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_68;
  pointer local_60;
  pointer local_58;
  string local_50;
  
  std::
  _Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear((_Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           *)this);
  local_60 = (agg_access_patterns->
             super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
             _M_impl.super__Vector_impl_data._M_start;
  local_58 = (agg_access_patterns->
             super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  if (local_60 != local_58) {
    this_00 = &(this->aggressor_to_addr)._M_h;
    local_68 = this_00;
    do {
      __k = (local_60->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl
            .super__Vector_impl_data._M_start;
      local_70 = (local_60->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if (__k != local_70) {
        do {
          sVar3 = std::
                  _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count(this_00,&__k->id);
          if (sVar3 == 0) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"Could not find DRAMAddr mapping for Aggressor %d","");
            format_string<int>((string *)local_a0,&local_50,__k->id);
            Logger::log_error((string *)local_a0,true);
            std::__cxx11::string::~string((string *)local_a0);
            std::__cxx11::string::~string((string *)&local_50);
            exit(1);
          }
          local_78 = __k;
          pmVar4 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&__k->id);
          bk = pmVar4->bank;
          sVar1 = pmVar4->row;
          iVar6 = -5;
          do {
            if ((iVar6 != 0) && (uVar2 = (int)sVar1 + iVar6, -1 < (int)uVar2)) {
              DRAMAddr::DRAMAddr((DRAMAddr *)local_a0,bk,(ulong)uVar2,0);
              local_50._M_dataplus._M_p = (pointer)DRAMAddr::to_virt((DRAMAddr *)local_a0);
              sVar5 = std::
                      _Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      ::count((_Hashtable<volatile_char_*,_volatile_char_*,_std::allocator<volatile_char_*>,_std::__detail::_Identity,_std::equal_to<volatile_char_*>,_std::hash<volatile_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                               *)this,(key_type *)&local_50);
              if (sVar5 == 0) {
                local_80 = DRAMAddr::to_virt((DRAMAddr *)local_a0);
                local_50._M_dataplus._M_p = (pointer)this;
                std::
                _Hashtable<char_volatile*,char_volatile*,std::allocator<char_volatile*>,std::__detail::_Identity,std::equal_to<char_volatile*>,std::hash<char_volatile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<char_volatile*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<char_volatile*,false>>>>
                          ((_Hashtable<char_volatile*,char_volatile*,std::allocator<char_volatile*>,std::__detail::_Identity,std::equal_to<char_volatile*>,std::hash<char_volatile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)this,&local_80,&local_50);
              }
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 != 6);
          __k = local_78 + 1;
          this_00 = local_68;
        } while (__k != local_70);
      }
      local_60 = local_60 + 1;
    } while (local_60 != local_58);
  }
  return;
}

Assistant:

void PatternAddressMapper::determine_victims(const std::vector<AggressorAccessPattern> &agg_access_patterns) {
  // check ROW_THRESHOLD rows around the aggressors for flipped bits
  const int ROW_THRESHOLD = 5;
  // a set to make sure we add victims only once
  victim_rows.clear();
  for (auto &acc_pattern : agg_access_patterns) {
    for (auto &agg : acc_pattern.aggressors) {

      if (aggressor_to_addr.count(agg.id)==0) {
        Logger::log_error(format_string("Could not find DRAMAddr mapping for Aggressor %d", agg.id));
        exit(EXIT_FAILURE);
      }

      const auto dram_addr = aggressor_to_addr.at(agg.id);

      for (int delta_nrows = -ROW_THRESHOLD; delta_nrows <= ROW_THRESHOLD; ++delta_nrows) {
        auto cur_row_candidate = static_cast<int>(dram_addr.row) + delta_nrows;

        // don't add the aggressor itself and ignore any non-existing (negative) row no.
        if (delta_nrows == 0 || cur_row_candidate < 0)
          continue;

        // ignore this victim if we already added it before
        auto victim_start = DRAMAddr(dram_addr.bank, static_cast<size_t>(cur_row_candidate), 0);
        if (victim_rows.count(static_cast<volatile char *>(victim_start.to_virt())) > 0)
          continue;

        victim_rows.insert(static_cast<volatile char *>(victim_start.to_virt()));
      }
    }
  }
}